

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O2

message_client_connection_t * message_client_connection_new(uint8_t addressFamily)

{
  int32_t iVar1;
  message_client_connection_t *self;
  
  self = (message_client_connection_t *)malloc(0x30);
  if (self != (message_client_connection_t *)0x0) {
    iVar1 = message_client_connection_create(self,addressFamily);
    if (iVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (message_client_connection_t *)0x0;
}

Assistant:

message_client_connection_t *message_client_connection_new(uint8_t addressFamily)
{
   message_client_connection_t *self = (message_client_connection_t*) malloc(sizeof(message_client_connection_t));
   if (self != 0)
   {
      int32_t result = message_client_connection_create(self, addressFamily);
      if (result != 0)
      {
         free(self);
         self = (message_client_connection_t*) 0;
      }
   }
   return self;
}